

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O1

X509 * X509_find_by_subject(stack_st_X509 *sk,X509_NAME *name)

{
  int iVar1;
  size_t sVar2;
  X509 *pXVar3;
  size_t sVar4;
  
  sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      pXVar3 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)sk,sVar2);
      iVar1 = X509_NAME_cmp(pXVar3->cert_info->subject,name);
      if (iVar1 == 0) {
        return pXVar3;
      }
      sVar2 = sVar2 + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
    } while (sVar2 < sVar4);
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_find_by_subject(const STACK_OF(X509) *sk, X509_NAME *name) {
  for (size_t i = 0; i < sk_X509_num(sk); i++) {
    X509 *x509 = sk_X509_value(sk, i);
    if (X509_NAME_cmp(X509_get_subject_name(x509), name) == 0) {
      return x509;
    }
  }
  return NULL;
}